

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::TriangleMesh> *recalculatePrimRef)

{
  Geometry *pGVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  size_t i;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  float fVar22;
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  float fVar36;
  float fVar37;
  float fVar39;
  float fVar40;
  undefined1 auVar38 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar46;
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  
  fVar15 = time_range.lower;
  fVar21 = time_range.upper;
  fVar26 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar25 = (set->super_PrimInfoMB).max_time_range.upper - fVar26;
  fVar17 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar16 = roundf((((fVar15 * 0.5 + fVar21 * 0.5) - fVar26) / fVar25) * fVar17);
  fVar26 = (fVar16 / fVar17) * fVar25 + fVar26;
  if (begin < end && !(bool)(~(fVar15 < fVar26 && fVar26 < fVar21) & 1)) {
    do {
      if ((fVar15 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar26)) {
        fVar25 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pGVar1 = (recalculatePrimRef->scene->geometries).items
                 [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        fVar16 = pGVar1->fnumTimeSegments;
        fVar17 = (pGVar1->time_range).lower;
        fVar22 = (pGVar1->time_range).upper - fVar17;
        fVar30 = (fVar15 - fVar17) / fVar22;
        fVar22 = (fVar26 - fVar17) / fVar22;
        fVar37 = fVar16 * fVar22;
        fVar17 = floorf(fVar16 * fVar30);
        fVar18 = ceilf(fVar37);
        iVar6 = (int)fVar17;
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar19 = fVar18;
        if (fVar16 <= fVar18) {
          fVar19 = fVar16;
        }
        if (iVar6 < 0) {
          iVar6 = -1;
        }
        uVar5 = (int)fVar16 + 1U;
        if ((int)fVar18 < (int)((int)fVar16 + 1U)) {
          uVar5 = (int)fVar18;
        }
        lVar2 = *(long *)&pGVar1->field_0x58;
        lVar9 = (ulong)(uint)fVar25 *
                pGVar1[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        uVar8 = (ulong)*(uint *)(lVar2 + lVar9);
        uVar10 = (ulong)*(uint *)(lVar2 + 4 + lVar9);
        lVar3 = *(long *)&pGVar1[2].numPrimitives;
        lVar13 = (long)(int)fVar17 * 0x38;
        lVar4 = *(long *)(lVar3 + lVar13);
        lVar14 = *(long *)(lVar3 + 0x10 + lVar13);
        auVar43 = *(undefined1 (*) [16])(lVar4 + lVar14 * uVar8);
        auVar57 = *(undefined1 (*) [16])(lVar4 + lVar14 * uVar10);
        uVar11 = (ulong)*(uint *)(lVar2 + 8 + lVar9);
        auVar32 = *(undefined1 (*) [16])(lVar4 + lVar14 * uVar11);
        auVar23 = minps(auVar43,auVar57);
        auVar23 = minps(auVar23,auVar32);
        auVar43 = maxps(auVar43,auVar57);
        auVar44 = maxps(auVar43,auVar32);
        lVar14 = (long)(int)fVar19 * 0x38;
        lVar2 = *(long *)(lVar3 + lVar14);
        lVar4 = *(long *)(lVar3 + 0x10 + lVar14);
        auVar43 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar8);
        auVar57 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar10);
        auVar32 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar11);
        auVar27 = minps(auVar43,auVar57);
        auVar27 = minps(auVar27,auVar32);
        auVar43 = maxps(auVar43,auVar57);
        auVar43 = maxps(auVar43,auVar32);
        fVar17 = fVar16 * fVar30 - fVar17;
        fVar36 = auVar27._0_4_;
        fVar25 = auVar23._0_4_;
        fVar47 = auVar43._0_4_;
        fVar48 = auVar43._4_4_;
        fVar49 = auVar43._8_4_;
        fVar51 = auVar43._12_4_;
        fVar42 = auVar44._0_4_;
        fVar50 = auVar44._4_4_;
        fVar52 = auVar44._8_4_;
        fVar46 = auVar44._12_4_;
        fVar18 = auVar23._4_4_;
        fVar34 = auVar23._8_4_;
        fVar35 = auVar23._12_4_;
        fVar39 = auVar27._4_4_;
        fVar40 = auVar27._8_4_;
        fVar41 = auVar27._12_4_;
        if (uVar5 - iVar6 == 1) {
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar16 = 1.0 - fVar17;
          auVar57._4_4_ = fVar16 * fVar18 + fVar17 * fVar39;
          auVar57._0_4_ = fVar16 * fVar25 + fVar17 * fVar36;
          auVar32._0_4_ = fVar16 * fVar42 + fVar17 * fVar47;
          auVar32._4_4_ = fVar16 * fVar50 + fVar17 * fVar48;
          auVar32._8_4_ = fVar16 * fVar52 + fVar17 * fVar49;
          auVar32._12_4_ = fVar16 * fVar46 + fVar17 * fVar51;
          fVar19 = fVar19 - fVar37;
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          fVar22 = 1.0 - fVar19;
          auVar23._0_4_ = fVar36 * fVar22 + fVar25 * fVar19;
          auVar23._4_4_ = fVar39 * fVar22 + fVar18 * fVar19;
          auVar23._8_4_ = fVar40 * fVar22 + fVar34 * fVar19;
          auVar23._12_4_ = fVar41 * fVar22 + fVar35 * fVar19;
          auVar27._0_4_ = fVar22 * fVar47 + fVar19 * fVar42;
          auVar27._4_4_ = fVar22 * fVar48 + fVar19 * fVar50;
          auVar27._8_4_ = fVar22 * fVar49 + fVar19 * fVar52;
          auVar27._12_4_ = fVar22 * fVar51 + fVar19 * fVar46;
          auVar57._8_4_ = fVar16 * fVar34 + fVar17 * fVar40;
          auVar57._12_4_ = fVar16 * fVar35 + fVar17 * fVar41;
        }
        else {
          lVar2 = *(long *)(lVar3 + 0x38 + lVar13);
          lVar4 = *(long *)(lVar3 + 0x48 + lVar13);
          auVar43 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar8);
          auVar57 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar10);
          auVar32 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar11);
          auVar23 = minps(auVar43,auVar57);
          auVar44 = minps(auVar23,auVar32);
          auVar43 = maxps(auVar43,auVar57);
          auVar23 = maxps(auVar43,auVar32);
          lVar2 = *(long *)(lVar3 + -0x38 + lVar14);
          lVar4 = *(long *)(lVar3 + -0x28 + lVar14);
          auVar43 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar8);
          auVar57 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar10);
          auVar32 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar11);
          auVar27 = minps(auVar43,auVar57);
          auVar27 = minps(auVar27,auVar32);
          auVar43 = maxps(auVar43,auVar57);
          auVar43 = maxps(auVar43,auVar32);
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar31 = 1.0 - fVar17;
          auVar57._0_4_ = fVar25 * fVar31 + auVar44._0_4_ * fVar17;
          auVar57._4_4_ = fVar18 * fVar31 + auVar44._4_4_ * fVar17;
          auVar57._8_4_ = fVar34 * fVar31 + auVar44._8_4_ * fVar17;
          auVar57._12_4_ = fVar35 * fVar31 + auVar44._12_4_ * fVar17;
          auVar32._0_4_ = fVar31 * fVar42 + fVar17 * auVar23._0_4_;
          auVar32._4_4_ = fVar31 * fVar50 + fVar17 * auVar23._4_4_;
          auVar32._8_4_ = fVar31 * fVar52 + fVar17 * auVar23._8_4_;
          auVar32._12_4_ = fVar31 * fVar46 + fVar17 * auVar23._12_4_;
          fVar19 = fVar19 - fVar37;
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          fVar17 = 1.0 - fVar19;
          auVar23._0_4_ = fVar36 * fVar17 + auVar27._0_4_ * fVar19;
          auVar23._4_4_ = fVar39 * fVar17 + auVar27._4_4_ * fVar19;
          auVar23._8_4_ = fVar40 * fVar17 + auVar27._8_4_ * fVar19;
          auVar23._12_4_ = fVar41 * fVar17 + auVar27._12_4_ * fVar19;
          auVar27._0_4_ = fVar17 * fVar47 + fVar19 * auVar43._0_4_;
          auVar27._4_4_ = fVar17 * fVar48 + fVar19 * auVar43._4_4_;
          auVar27._8_4_ = fVar17 * fVar49 + fVar19 * auVar43._8_4_;
          auVar27._12_4_ = fVar17 * fVar51 + fVar19 * auVar43._12_4_;
          uVar7 = iVar6 + 1;
          if ((int)uVar7 < (int)uVar5) {
            plVar12 = (long *)(lVar3 + (ulong)uVar7 * 0x38 + 0x10);
            do {
              fVar42 = ((float)(int)uVar7 / fVar16 - fVar30) / (fVar22 - fVar30);
              fVar17 = 1.0 - fVar42;
              fVar37 = auVar23._4_4_;
              fVar19 = auVar23._12_4_;
              fVar50 = auVar23._8_4_;
              fVar25 = auVar57._4_4_;
              fVar18 = auVar57._12_4_;
              fVar52 = auVar57._8_4_;
              fVar39 = auVar27._4_4_;
              fVar40 = auVar27._8_4_;
              fVar41 = auVar27._12_4_;
              fVar34 = auVar32._4_4_;
              fVar35 = auVar32._8_4_;
              fVar36 = auVar32._12_4_;
              lVar2 = plVar12[-2];
              lVar3 = *plVar12;
              auVar43 = *(undefined1 (*) [16])(lVar2 + lVar3 * uVar8);
              auVar44 = *(undefined1 (*) [16])(lVar2 + lVar3 * uVar10);
              auVar55 = *(undefined1 (*) [16])(lVar2 + lVar3 * uVar11);
              auVar53 = minps(auVar43,auVar44);
              auVar53 = minps(auVar53,auVar55);
              auVar54._0_4_ = auVar53._0_4_ - (auVar57._0_4_ * fVar17 + auVar23._0_4_ * fVar42);
              auVar54._4_4_ = auVar53._4_4_ - (fVar25 * fVar17 + fVar37 * fVar42);
              auVar54._8_4_ = auVar53._8_4_ - (fVar52 * fVar17 + fVar50 * fVar42);
              auVar54._12_4_ = auVar53._12_4_ - (fVar18 * fVar17 + fVar19 * fVar42);
              auVar43 = maxps(auVar43,auVar44);
              auVar43 = maxps(auVar43,auVar55);
              auVar44._0_4_ = auVar43._0_4_ - (fVar17 * auVar32._0_4_ + fVar42 * auVar27._0_4_);
              auVar44._4_4_ = auVar43._4_4_ - (fVar17 * fVar34 + fVar42 * fVar39);
              auVar44._8_4_ = auVar43._8_4_ - (fVar17 * fVar35 + fVar42 * fVar40);
              auVar44._12_4_ = auVar43._12_4_ - (fVar17 * fVar36 + fVar42 * fVar41);
              auVar55 = minps(auVar54,ZEXT816(0));
              auVar43 = maxps(auVar44,ZEXT816(0));
              auVar57._0_4_ = auVar57._0_4_ + auVar55._0_4_;
              auVar57._4_4_ = fVar25 + auVar55._4_4_;
              auVar57._8_4_ = fVar52 + auVar55._8_4_;
              auVar57._12_4_ = fVar18 + auVar55._12_4_;
              auVar23._0_4_ = auVar23._0_4_ + auVar55._0_4_;
              auVar23._4_4_ = fVar37 + auVar55._4_4_;
              auVar23._8_4_ = fVar50 + auVar55._8_4_;
              auVar23._12_4_ = fVar19 + auVar55._12_4_;
              auVar32._0_4_ = auVar32._0_4_ + auVar43._0_4_;
              auVar32._4_4_ = fVar34 + auVar43._4_4_;
              auVar32._8_4_ = fVar35 + auVar43._8_4_;
              auVar32._12_4_ = fVar36 + auVar43._12_4_;
              auVar27._0_4_ = auVar27._0_4_ + auVar43._0_4_;
              auVar27._4_4_ = fVar39 + auVar43._4_4_;
              auVar27._8_4_ = fVar40 + auVar43._8_4_;
              auVar27._12_4_ = fVar41 + auVar43._12_4_;
              uVar7 = uVar7 + 1;
              plVar12 = plVar12 + 7;
            } while (uVar5 != uVar7);
          }
        }
        aVar20.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,auVar57);
        aVar24.m128 = (__m128)maxps(this->bounds0[0].bounds0.upper.field_0,auVar32);
        aVar33.m128 = (__m128)minps(this->bounds0[0].bounds1.lower.field_0,auVar23);
        aVar28.m128 = (__m128)maxps(this->bounds0[0].bounds1.upper.field_0,auVar27);
        this->bounds0[0].bounds0.lower.field_0 = aVar20;
        this->bounds0[0].bounds0.upper.field_0 = aVar24;
        this->bounds0[0].bounds1.lower.field_0 = aVar33;
        this->bounds0[0].bounds1.upper.field_0 = aVar28;
        fVar22 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar25 = prims[begin].time_range.lower;
        fVar18 = prims[begin].time_range.upper - fVar25;
        fVar17 = floorf(((fVar15 - fVar25) / fVar18) * 1.0000002 * fVar22);
        fVar16 = 0.0;
        if (0.0 <= fVar17) {
          fVar16 = fVar17;
        }
        fVar17 = ceilf(((fVar26 - fVar25) / fVar18) * 0.99999976 * fVar22);
        if (fVar22 <= fVar17) {
          fVar17 = fVar22;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar17 - (int)fVar16);
      }
      if ((fVar26 < prims[begin].time_range.upper * 0.9999) &&
         (prims[begin].time_range.lower * 1.0001 < fVar21)) {
        fVar25 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pGVar1 = (recalculatePrimRef->scene->geometries).items
                 [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        fVar16 = pGVar1->fnumTimeSegments;
        fVar17 = (pGVar1->time_range).lower;
        fVar22 = (pGVar1->time_range).upper - fVar17;
        fVar30 = (fVar26 - fVar17) / fVar22;
        fVar22 = (fVar21 - fVar17) / fVar22;
        fVar37 = fVar16 * fVar22;
        fVar17 = floorf(fVar16 * fVar30);
        fVar18 = ceilf(fVar37);
        iVar6 = (int)fVar17;
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar19 = fVar18;
        if (fVar16 <= fVar18) {
          fVar19 = fVar16;
        }
        if (iVar6 < 0) {
          iVar6 = -1;
        }
        uVar5 = (int)fVar16 + 1U;
        if ((int)fVar18 < (int)((int)fVar16 + 1U)) {
          uVar5 = (int)fVar18;
        }
        lVar2 = *(long *)&pGVar1->field_0x58;
        lVar9 = (ulong)(uint)fVar25 *
                pGVar1[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        uVar8 = (ulong)*(uint *)(lVar2 + lVar9);
        uVar10 = (ulong)*(uint *)(lVar2 + 4 + lVar9);
        lVar3 = *(long *)&pGVar1[2].numPrimitives;
        lVar13 = (long)(int)fVar17 * 0x38;
        lVar4 = *(long *)(lVar3 + lVar13);
        lVar14 = *(long *)(lVar3 + 0x10 + lVar13);
        auVar43 = *(undefined1 (*) [16])(lVar4 + lVar14 * uVar8);
        auVar57 = *(undefined1 (*) [16])(lVar4 + lVar14 * uVar10);
        uVar11 = (ulong)*(uint *)(lVar2 + 8 + lVar9);
        auVar32 = *(undefined1 (*) [16])(lVar4 + lVar14 * uVar11);
        auVar23 = minps(auVar43,auVar57);
        auVar23 = minps(auVar23,auVar32);
        auVar43 = maxps(auVar43,auVar57);
        auVar44 = maxps(auVar43,auVar32);
        lVar14 = (long)(int)fVar19 * 0x38;
        lVar2 = *(long *)(lVar3 + lVar14);
        lVar4 = *(long *)(lVar3 + 0x10 + lVar14);
        auVar43 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar8);
        auVar57 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar10);
        auVar32 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar11);
        auVar27 = minps(auVar43,auVar57);
        auVar27 = minps(auVar27,auVar32);
        auVar43 = maxps(auVar43,auVar57);
        auVar43 = maxps(auVar43,auVar32);
        fVar17 = fVar16 * fVar30 - fVar17;
        fVar36 = auVar27._0_4_;
        fVar25 = auVar23._0_4_;
        fVar47 = auVar43._0_4_;
        fVar48 = auVar43._4_4_;
        fVar49 = auVar43._8_4_;
        fVar51 = auVar43._12_4_;
        fVar42 = auVar44._0_4_;
        fVar50 = auVar44._4_4_;
        fVar52 = auVar44._8_4_;
        fVar46 = auVar44._12_4_;
        fVar18 = auVar23._4_4_;
        fVar34 = auVar23._8_4_;
        fVar35 = auVar23._12_4_;
        fVar39 = auVar27._4_4_;
        fVar40 = auVar27._8_4_;
        fVar41 = auVar27._12_4_;
        if (uVar5 - iVar6 == 1) {
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar16 = 1.0 - fVar17;
          auVar55._4_4_ = fVar16 * fVar18 + fVar17 * fVar39;
          auVar55._0_4_ = fVar16 * fVar25 + fVar17 * fVar36;
          auVar53._0_4_ = fVar16 * fVar42 + fVar17 * fVar47;
          auVar53._4_4_ = fVar16 * fVar50 + fVar17 * fVar48;
          auVar53._8_4_ = fVar16 * fVar52 + fVar17 * fVar49;
          auVar53._12_4_ = fVar16 * fVar46 + fVar17 * fVar51;
          fVar19 = fVar19 - fVar37;
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          fVar22 = 1.0 - fVar19;
          auVar29._0_4_ = fVar36 * fVar22 + fVar25 * fVar19;
          auVar29._4_4_ = fVar39 * fVar22 + fVar18 * fVar19;
          auVar29._8_4_ = fVar40 * fVar22 + fVar34 * fVar19;
          auVar29._12_4_ = fVar41 * fVar22 + fVar35 * fVar19;
          auVar38._0_4_ = fVar22 * fVar47 + fVar19 * fVar42;
          auVar38._4_4_ = fVar22 * fVar48 + fVar19 * fVar50;
          auVar38._8_4_ = fVar22 * fVar49 + fVar19 * fVar52;
          auVar38._12_4_ = fVar22 * fVar51 + fVar19 * fVar46;
          auVar55._8_4_ = fVar16 * fVar34 + fVar17 * fVar40;
          auVar55._12_4_ = fVar16 * fVar35 + fVar17 * fVar41;
        }
        else {
          lVar2 = *(long *)(lVar3 + 0x38 + lVar13);
          lVar4 = *(long *)(lVar3 + 0x48 + lVar13);
          auVar43 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar8);
          auVar57 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar10);
          auVar32 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar11);
          auVar23 = minps(auVar43,auVar57);
          auVar44 = minps(auVar23,auVar32);
          auVar43 = maxps(auVar43,auVar57);
          auVar23 = maxps(auVar43,auVar32);
          lVar2 = *(long *)(lVar3 + -0x38 + lVar14);
          lVar4 = *(long *)(lVar3 + -0x28 + lVar14);
          auVar43 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar8);
          auVar57 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar10);
          auVar32 = *(undefined1 (*) [16])(lVar2 + lVar4 * uVar11);
          auVar27 = minps(auVar43,auVar57);
          auVar27 = minps(auVar27,auVar32);
          auVar43 = maxps(auVar43,auVar57);
          auVar43 = maxps(auVar43,auVar32);
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar31 = 1.0 - fVar17;
          auVar55._0_4_ = fVar25 * fVar31 + auVar44._0_4_ * fVar17;
          auVar55._4_4_ = fVar18 * fVar31 + auVar44._4_4_ * fVar17;
          auVar55._8_4_ = fVar34 * fVar31 + auVar44._8_4_ * fVar17;
          auVar55._12_4_ = fVar35 * fVar31 + auVar44._12_4_ * fVar17;
          auVar53._0_4_ = fVar31 * fVar42 + fVar17 * auVar23._0_4_;
          auVar53._4_4_ = fVar31 * fVar50 + fVar17 * auVar23._4_4_;
          auVar53._8_4_ = fVar31 * fVar52 + fVar17 * auVar23._8_4_;
          auVar53._12_4_ = fVar31 * fVar46 + fVar17 * auVar23._12_4_;
          fVar19 = fVar19 - fVar37;
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          fVar17 = 1.0 - fVar19;
          auVar29._0_4_ = fVar36 * fVar17 + auVar27._0_4_ * fVar19;
          auVar29._4_4_ = fVar39 * fVar17 + auVar27._4_4_ * fVar19;
          auVar29._8_4_ = fVar40 * fVar17 + auVar27._8_4_ * fVar19;
          auVar29._12_4_ = fVar41 * fVar17 + auVar27._12_4_ * fVar19;
          auVar38._0_4_ = fVar17 * fVar47 + fVar19 * auVar43._0_4_;
          auVar38._4_4_ = fVar17 * fVar48 + fVar19 * auVar43._4_4_;
          auVar38._8_4_ = fVar17 * fVar49 + fVar19 * auVar43._8_4_;
          auVar38._12_4_ = fVar17 * fVar51 + fVar19 * auVar43._12_4_;
          uVar7 = iVar6 + 1;
          if ((int)uVar7 < (int)uVar5) {
            plVar12 = (long *)(lVar3 + (ulong)uVar7 * 0x38 + 0x10);
            do {
              fVar42 = ((float)(int)uVar7 / fVar16 - fVar30) / (fVar22 - fVar30);
              fVar17 = 1.0 - fVar42;
              fVar37 = auVar29._4_4_;
              fVar19 = auVar29._12_4_;
              fVar50 = auVar29._8_4_;
              fVar25 = auVar55._4_4_;
              fVar18 = auVar55._12_4_;
              fVar52 = auVar55._8_4_;
              fVar39 = auVar38._4_4_;
              fVar40 = auVar38._8_4_;
              fVar41 = auVar38._12_4_;
              fVar34 = auVar53._4_4_;
              fVar35 = auVar53._8_4_;
              fVar36 = auVar53._12_4_;
              lVar2 = plVar12[-2];
              lVar3 = *plVar12;
              auVar43 = *(undefined1 (*) [16])(lVar2 + lVar3 * uVar8);
              auVar57 = *(undefined1 (*) [16])(lVar2 + lVar3 * uVar10);
              auVar32 = *(undefined1 (*) [16])(lVar2 + lVar3 * uVar11);
              auVar23 = minps(auVar43,auVar57);
              auVar23 = minps(auVar23,auVar32);
              auVar56._0_4_ = auVar23._0_4_ - (auVar55._0_4_ * fVar17 + auVar29._0_4_ * fVar42);
              auVar56._4_4_ = auVar23._4_4_ - (fVar25 * fVar17 + fVar37 * fVar42);
              auVar56._8_4_ = auVar23._8_4_ - (fVar52 * fVar17 + fVar50 * fVar42);
              auVar56._12_4_ = auVar23._12_4_ - (fVar18 * fVar17 + fVar19 * fVar42);
              auVar43 = maxps(auVar43,auVar57);
              auVar43 = maxps(auVar43,auVar32);
              auVar45._0_4_ = auVar43._0_4_ - (fVar17 * auVar53._0_4_ + fVar42 * auVar38._0_4_);
              auVar45._4_4_ = auVar43._4_4_ - (fVar17 * fVar34 + fVar42 * fVar39);
              auVar45._8_4_ = auVar43._8_4_ - (fVar17 * fVar35 + fVar42 * fVar40);
              auVar45._12_4_ = auVar43._12_4_ - (fVar17 * fVar36 + fVar42 * fVar41);
              auVar57 = minps(auVar56,ZEXT816(0));
              auVar43 = maxps(auVar45,ZEXT816(0));
              auVar55._0_4_ = auVar55._0_4_ + auVar57._0_4_;
              auVar55._4_4_ = fVar25 + auVar57._4_4_;
              auVar55._8_4_ = fVar52 + auVar57._8_4_;
              auVar55._12_4_ = fVar18 + auVar57._12_4_;
              auVar29._0_4_ = auVar29._0_4_ + auVar57._0_4_;
              auVar29._4_4_ = fVar37 + auVar57._4_4_;
              auVar29._8_4_ = fVar50 + auVar57._8_4_;
              auVar29._12_4_ = fVar19 + auVar57._12_4_;
              auVar53._0_4_ = auVar53._0_4_ + auVar43._0_4_;
              auVar53._4_4_ = fVar34 + auVar43._4_4_;
              auVar53._8_4_ = fVar35 + auVar43._8_4_;
              auVar53._12_4_ = fVar36 + auVar43._12_4_;
              auVar38._0_4_ = auVar38._0_4_ + auVar43._0_4_;
              auVar38._4_4_ = fVar39 + auVar43._4_4_;
              auVar38._8_4_ = fVar40 + auVar43._8_4_;
              auVar38._12_4_ = fVar41 + auVar43._12_4_;
              uVar7 = uVar7 + 1;
              plVar12 = plVar12 + 7;
            } while (uVar5 != uVar7);
          }
        }
        aVar20.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,auVar55);
        aVar24.m128 = (__m128)maxps(this->bounds1[0].bounds0.upper.field_0,auVar53);
        aVar33.m128 = (__m128)minps(this->bounds1[0].bounds1.lower.field_0,auVar29);
        aVar28.m128 = (__m128)maxps(this->bounds1[0].bounds1.upper.field_0,auVar38);
        this->bounds1[0].bounds0.lower.field_0 = aVar20;
        this->bounds1[0].bounds0.upper.field_0 = aVar24;
        this->bounds1[0].bounds1.lower.field_0 = aVar33;
        this->bounds1[0].bounds1.upper.field_0 = aVar28;
        fVar22 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar25 = prims[begin].time_range.lower;
        fVar18 = prims[begin].time_range.upper - fVar25;
        fVar17 = floorf(((fVar26 - fVar25) / fVar18) * 1.0000002 * fVar22);
        fVar16 = 0.0;
        if (0.0 <= fVar17) {
          fVar16 = fVar17;
        }
        fVar17 = ceilf(((fVar21 - fVar25) / fVar18) * 0.99999976 * fVar22);
        if (fVar22 <= fVar17) {
          fVar17 = fVar22;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar17 - (int)fVar16);
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }